

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

int __thiscall
pybind11::detail::argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>::
call_impl<int,int(*&)(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string),0ul,1ul,2ul,pybind11::detail::void_type>
          (argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *this,
          void_type *f,undefined8 param_3)

{
  code *pcVar1;
  int iVar2;
  __tuple_element_t<0UL,_tuple<type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *caster;
  template_cast_op_type<typename_std::add_rvalue_reference<basic_string<char>_>::type> pbVar3;
  __tuple_element_t<1UL,_tuple<type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *caster_00;
  __tuple_element_t<2UL,_tuple<type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *caster_01;
  string local_98 [48];
  string local_68 [32];
  string local_48 [32];
  undefined8 local_28;
  void_type *param_3_local;
  _func_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  **f_local;
  argument_loader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  pcVar1 = *(code **)f;
  local_28 = param_3;
  param_3_local = f;
  f_local = (_func_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
             **)this;
  caster = std::
           get<0ul,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                     ((tuple<pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                       *)this);
  pbVar3 = cast_op<std::__cxx11::string>(caster);
  std::__cxx11::string::string(local_48,(string *)pbVar3);
  caster_00 = std::
              get<1ul,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                        ((tuple<pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                          *)this);
  pbVar3 = cast_op<std::__cxx11::string>(caster_00);
  std::__cxx11::string::string(local_68,(string *)pbVar3);
  caster_01 = std::
              get<2ul,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                        ((tuple<pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                          *)this);
  pbVar3 = cast_op<std::__cxx11::string>(caster_01);
  std::__cxx11::string::string(local_98,(string *)pbVar3);
  iVar2 = (*pcVar1)(local_48,local_68,local_98);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return iVar2;
}

Assistant:

Return call_impl(Func &&f, index_sequence<Is...>, Guard &&) && {
        return std::forward<Func>(f)(cast_op<Args>(std::move(std::get<Is>(argcasters)))...);
    }